

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
StatisticsWriter::writeHistogram<double>
          (StatisticsWriter *this,ostream *stream,string *title,DynamicHistogram<double> *histogram)

{
  iterator iVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  uint uVar4;
  _Setw _Var5;
  reference pvVar6;
  reference pvVar7;
  reference plVar8;
  ostream *poVar9;
  size_type __n;
  double dVar10;
  double dVar11;
  string local_388;
  int local_364;
  string local_360;
  int local_33c;
  string local_338;
  int local_314;
  string local_310;
  int local_2ec;
  string local_2e8;
  int local_2c4;
  string local_2c0;
  int local_29c;
  uint local_298;
  allocator<char> local_291;
  uint i_1;
  string indent;
  allocator<char> local_251;
  string local_250 [8];
  string footer;
  string local_228 [8];
  string header;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_200;
  iterator it;
  long totalWidth;
  undefined1 local_1e8 [4];
  uint i;
  vector<double,_std::allocator<double>_> local_1d0;
  vector<double,_std::allocator<double>_> local_1b8;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<long> local_99;
  value_type_conflict3 local_98;
  undefined1 local_90 [8];
  vector<long,_std::allocator<long>_> width;
  vector<double,_std::allocator<double>_> cdf;
  vector<double,_std::allocator<double>_> pdf;
  vector<double,_std::allocator<double>_> freq;
  uint nBins;
  DynamicHistogram<double> *histogram_local;
  string *title_local;
  ostream *stream_local;
  StatisticsWriter *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_98 = 0;
  std::allocator<long>::allocator(&local_99);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_90,6,&local_98,&local_99);
  std::allocator<long>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Bin Min",&local_d1);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,0);
  StringParser::updateWidthString(&local_d0,pvVar6);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Bin Max",&local_f9);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,1);
  StringParser::updateWidthString(&local_f8,pvVar6);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Center",&local_121);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,2);
  StringParser::updateWidthString(&local_120,pvVar6);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Frequency",&local_149);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,3);
  StringParser::updateWidthString(&local_148,pvVar6);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"PDF",&local_171);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,4);
  StringParser::updateWidthString(&local_170,pvVar6);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"CDF",&local_199);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,5);
  StringParser::updateWidthString(&local_198,pvVar6);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  uVar4 = DynamicHistogram<double>::count(histogram);
  DynamicHistogram<double>::frequencies(&local_1b8,histogram);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_1b8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1b8);
  DynamicHistogram<double>::pdf(&local_1d0,histogram);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_1d0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1d0);
  DynamicHistogram<double>::cdf((vector<double,_std::allocator<double>_> *)local_1e8,histogram);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<double,_std::allocator<double>_> *)local_1e8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1e8);
  for (totalWidth._4_4_ = 0; totalWidth._4_4_ < uVar4; totalWidth._4_4_ = totalWidth._4_4_ + 1) {
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,0);
    StringParser::updateWidthNumber<long>((ulong)totalWidth._4_4_,pvVar6);
    dVar10 = DynamicHistogram<double>::bin(histogram,totalWidth._4_4_);
    dVar11 = DynamicHistogram<double>::width(histogram,totalWidth._4_4_);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,1);
    StringParser::updateWidthNumber<double>(dVar10 + dVar11 * -0.5,pvVar6);
    dVar10 = DynamicHistogram<double>::bin(histogram,totalWidth._4_4_);
    dVar11 = DynamicHistogram<double>::width(histogram,totalWidth._4_4_);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,2);
    StringParser::updateWidthNumber<double>(dVar10 + dVar11 * 0.5,pvVar6);
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        &pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)totalWidth._4_4_);
    dVar10 = *pvVar7;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,3);
    StringParser::updateWidthNumber<long_long>((long)dVar10,pvVar6);
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        &cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)totalWidth._4_4_);
    dVar10 = *pvVar7;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,4);
    StringParser::updateWidthNumber<double>(dVar10,pvVar6);
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        &width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)totalWidth._4_4_);
    dVar10 = *pvVar7;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,5);
    StringParser::updateWidthNumber<double>(dVar10,pvVar6);
  }
  it._M_current = (long *)0x0;
  local_200._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)local_90);
  while( true ) {
    header.field_2._8_8_ =
         std::vector<long,_std::allocator<long>_>::end
                   ((vector<long,_std::allocator<long>_> *)local_90);
    bVar2 = __gnu_cxx::operator!=
                      (&local_200,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       ((long)&header.field_2 + 8));
    iVar1 = it;
    if (!bVar2) break;
    plVar8 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_200);
    *plVar8 = *plVar8 + 3;
    plVar8 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_200);
    it._M_current = *plVar8 + it._M_current;
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&local_200);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,(size_type)iVar1._M_current,'=',
             (allocator<char> *)(footer.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(footer.field_2._M_local_buf + 0xf));
  iVar1 = it;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_250,(size_type)iVar1._M_current,'-',&local_251);
  std::allocator<char>::~allocator(&local_251);
  poVar9 = std::operator<<((ostream *)stream,(string *)this);
  poVar9 = std::operator<<(poVar9,local_228);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)stream,(string *)this);
  _Var3 = std::setfill<char>(' ');
  poVar9 = std::operator<<(poVar9,_Var3._M_c);
  _Var5 = std::setw((int)((ulong)((long)it._M_current - ((long)it._M_current >> 0x3f)) >> 1));
  poVar9 = std::operator<<(poVar9,_Var5);
  poVar9 = std::operator<<(poVar9,"Histogram of ");
  poVar9 = std::operator<<(poVar9,(string *)title);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)stream,(string *)this);
  poVar9 = std::operator<<(poVar9,local_228);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)stream,(string *)this);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,0);
  _Var5 = std::setw((int)*pvVar6);
  poVar9 = std::operator<<(poVar9,_Var5);
  poVar9 = std::operator<<(poVar9,"Bin");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::right);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,1);
  _Var5 = std::setw((int)*pvVar6);
  poVar9 = std::operator<<(poVar9,_Var5);
  poVar9 = std::operator<<(poVar9,"Min");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::right);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,2);
  _Var5 = std::setw((int)*pvVar6);
  poVar9 = std::operator<<(poVar9,_Var5);
  poVar9 = std::operator<<(poVar9,"Max");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::right);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,3);
  _Var5 = std::setw((int)*pvVar6);
  poVar9 = std::operator<<(poVar9,_Var5);
  poVar9 = std::operator<<(poVar9,"Frequency");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::right);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,4);
  indent.field_2._12_4_ = std::setw((int)*pvVar6);
  poVar9 = std::operator<<(poVar9,(_Setw)indent.field_2._12_4_);
  poVar9 = std::operator<<(poVar9,"PDF");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::right);
  pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)local_90,5);
  indent.field_2._8_4_ = std::setw((int)*pvVar6);
  poVar9 = std::operator<<(poVar9,(_Setw)indent.field_2._8_4_);
  poVar9 = std::operator<<(poVar9,"CDF");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  __n = std::__cxx11::string::size((string *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,__n,' ',&local_291);
  std::allocator<char>::~allocator(&local_291);
  for (local_298 = 0; local_298 < uVar4; local_298 = local_298 + 1) {
    std::operator<<((ostream *)stream,(string *)&i_1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,0);
    local_29c = (int)std::setw((int)*pvVar6);
    poVar9 = std::operator<<(poVar9,(_Setw)local_29c);
    StringParser::parseNumber<long>(&local_2c0,(ulong)local_298,false);
    std::operator<<(poVar9,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,1);
    local_2c4 = (int)std::setw((int)*pvVar6);
    poVar9 = std::operator<<(poVar9,(_Setw)local_2c4);
    dVar10 = DynamicHistogram<double>::bin(histogram,local_298);
    dVar11 = DynamicHistogram<double>::width(histogram,local_298);
    StringParser::parseNumber<double>(&local_2e8,dVar10 + dVar11 * -0.5,false);
    std::operator<<(poVar9,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,2);
    local_2ec = (int)std::setw((int)*pvVar6);
    poVar9 = std::operator<<(poVar9,(_Setw)local_2ec);
    dVar10 = DynamicHistogram<double>::bin(histogram,local_298);
    dVar11 = DynamicHistogram<double>::width(histogram,local_298);
    StringParser::parseNumber<double>(&local_310,dVar10 + dVar11 * 0.5,false);
    std::operator<<(poVar9,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,3);
    local_314 = (int)std::setw((int)*pvVar6);
    poVar9 = std::operator<<(poVar9,(_Setw)local_314);
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        &pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_298);
    StringParser::parseNumber<long_long>(&local_338,(long)*pvVar7,false);
    std::operator<<(poVar9,(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,4);
    local_33c = (int)std::setw((int)*pvVar6);
    poVar9 = std::operator<<(poVar9,(_Setw)local_33c);
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        &cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_298);
    StringParser::parseNumber<double>(&local_360,*pvVar7,false);
    std::operator<<(poVar9,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)stream,std::right);
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_90,5);
    local_364 = (int)std::setw((int)*pvVar6);
    poVar9 = std::operator<<(poVar9,(_Setw)local_364);
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        &width.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_298);
    StringParser::parseNumber<double>(&local_388,*pvVar7,false);
    std::operator<<(poVar9,(string *)&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::ostream::operator<<((ostream *)stream,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&i_1);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_228);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_90)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &width.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &cdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &pdf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<((ostream *)stream,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
    writeHistogram(std::ostream & stream,
                   std::string const & title,
                   DynamicHistogram<T> & histogram)
    {

        try
        {

            unsigned int nBins = 0;
            std::vector<double> freq;
            std::vector<double> pdf;
            std::vector<double> cdf;

            // Compute column widths
            std::vector<long> width(6,0);
            StringParser::updateWidthString("Bin Min", width[0]);
            StringParser::updateWidthString("Bin Max", width[1]);
            StringParser::updateWidthString("Center", width[2]);
            StringParser::updateWidthString("Frequency", width[3]);
            StringParser::updateWidthString("PDF", width[4]);
            StringParser::updateWidthString("CDF", width[5]);

            nBins = histogram.count();
            freq = histogram.frequencies();
            pdf = histogram.pdf();
            cdf = histogram.cdf();
            for (unsigned int i = 0; i < nBins; i++)
            {
                StringParser::updateWidthNumber<long>(i, width[0]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)-histogram.width(i)/2, width[1]);
                StringParser::updateWidthNumber<double>(histogram.bin(i)+histogram.width(i)/2, width[2]);
                StringParser::updateWidthNumber<long long>((long long)freq.at(i), width[3]);
                StringParser::updateWidthNumber<double>(pdf.at(i), width[4]);
                StringParser::updateWidthNumber<double>(cdf.at(i), width[5]);
            }

            long totalWidth = 0;
            for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
            {
                (*it) += 3;
                totalWidth += *it;
            }

            // Print data headers
            std::string header(totalWidth,'=');
            std::string footer(totalWidth,'-');
            stream << this->_comment << header << std::endl;
            stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << "Histogram of " << title << std::endl;
            stream << this->_comment << header << std::endl;
            stream << this->_comment;
            stream << std::right << std::setw(width[0]) << "Bin"
                   << std::right << std::setw(width[1]) << "Min"
                   << std::right << std::setw(width[2]) << "Max"
                   << std::right << std::setw(width[3]) << "Frequency"
                   << std::right << std::setw(width[4]) << "PDF"
                   << std::right << std::setw(width[5]) << "CDF"
                   << std::endl;

            // Print data
            std::string indent(this->_comment.size(), ' ');
            for (unsigned int i = 0; i < nBins; i++)
            {
                stream << indent;
                stream << std::right << std::setw(width[0]) << StringParser::parseNumber<long>(i);
                stream << std::right << std::setw(width[1]) << StringParser::parseNumber<double>(histogram.bin(i)-histogram.width(i)/2);
                stream << std::right << std::setw(width[2]) << StringParser::parseNumber<double>(histogram.bin(i)+histogram.width(i)/2);
                stream << std::right << std::setw(width[3]) << StringParser::parseNumber<long long>((long long)freq.at(i));
                stream << std::right << std::setw(width[4]) << StringParser::parseNumber<double>(pdf.at(i));
                stream << std::right << std::setw(width[5]) << StringParser::parseNumber<double>(cdf.at(i));
                stream << std::endl;
            }

        }
        catch (...)
        {
            stream << "No valid data" << std::endl;
        }
        stream << std::endl;

        return;
    }